

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O3

CURLcode Curl_proxyCONNECT(Curl_easy *data,int sockindex,char *hostname,int remote_port)

{
  curl_off_t *pcVar1;
  char **ppcVar2;
  undefined1 *puVar3;
  long lVar4;
  ulong uVar5;
  dynbuf *s;
  curl_socket_t *pcVar6;
  _Bool _Var7;
  byte bVar8;
  anon_enum_32 aVar9;
  CURLcode CVar10;
  CURLcode CVar11;
  CURLcode CVar12;
  int iVar13;
  CHUNKcode CVar14;
  char *pcVar15;
  char *pcVar16;
  timediff_t tVar17;
  size_t sVar18;
  char *pcVar19;
  http_connect_state *phVar20;
  char *pcVar21;
  char *pcVar22;
  connectdata *pcVar23;
  connectdata *pcVar24;
  bool bVar25;
  char byte;
  size_t fillcount;
  int subversion;
  ssize_t tookcareof;
  CURLcode extra;
  char local_b1;
  connectdata *local_b0;
  int local_a4;
  connectdata *local_a0;
  size_t local_98;
  dynbuf *local_90;
  int *local_88;
  curl_off_t *local_80;
  dynbuf *local_78;
  uint local_6c;
  curl_socket_t local_68;
  undefined4 local_64;
  curl_socket_t *local_60;
  anon_union_8_12_57927972_for_p local_58;
  ssize_t local_50;
  curl_off_t *local_48;
  char *local_40;
  CURLcode local_34;
  
  pcVar24 = data->conn;
  phVar20 = pcVar24->connect_state;
  local_a4 = sockindex;
  local_6c = remote_port;
  local_40 = hostname;
  if (phVar20 == (http_connect_state *)0x0) {
    CVar10 = connect_init(data,false);
    if (CVar10 != CURLE_OK) {
      return CVar10;
    }
    pcVar23 = data->conn;
    phVar20 = pcVar23->connect_state;
    local_64 = 0;
    if (phVar20 != (http_connect_state *)0x0) {
      pcVar16 = (pcVar23->chunk).hexbuffer + (long)sockindex * 4 + -0x3d;
      goto LAB_0013b4d4;
    }
  }
  else {
    pcVar16 = (pcVar24->chunk).hexbuffer + (long)sockindex * 4 + -0x3d;
    pcVar23 = pcVar24;
LAB_0013b4d4:
    local_60 = (curl_socket_t *)(pcVar16 + 0x1e0);
    local_64 = 0;
    if (phVar20->tunnel_state < TUNNEL_COMPLETE) {
      local_68 = *local_60;
      local_58 = (data->req).p;
      puVar3 = &(pcVar23->bits).field_0x4;
      *(uint *)puVar3 = *(uint *)puVar3 & 0xffffffef;
      local_90 = &phVar20->req;
      local_48 = &(data->info).request_size;
      local_78 = &phVar20->rcvbuf;
      local_88 = &(data->req).httpcode;
      local_80 = &phVar20->cl;
      local_b0 = pcVar23;
      do {
        aVar9 = phVar20->tunnel_state;
        do {
          pcVar16 = local_40;
          if (aVar9 == TUNNEL_INIT) {
            Curl_infof(data,"Establish HTTP proxy tunnel to %s:%d",local_40,(ulong)local_6c);
            (*Curl_cfree)((data->req).newurl);
            (data->req).newurl = (char *)0x0;
            Curl_dyn_init(local_90,0x100000);
            if ((pcVar23->host).name == pcVar16) {
              bVar25 = (bool)(((pcVar23->bits).field_0x5 & 8) >> 3);
            }
            else {
              pcVar15 = strchr(pcVar16,0x3a);
              bVar25 = pcVar15 != (char *)0x0;
            }
            pcVar19 = "";
            pcVar15 = "";
            if (bVar25 != false) {
              pcVar15 = "[";
              pcVar19 = "]";
            }
            pcVar16 = curl_maprintf("%s%s%s:%d",pcVar15,pcVar16,pcVar19,(ulong)local_6c);
            CVar10 = CURLE_OUT_OF_MEMORY;
            if (pcVar16 == (char *)0x0) goto LAB_0013c15e;
            pcVar15 = Curl_checkProxyheaders(data,local_b0,"Host",4);
            if (pcVar15 == (char *)0x0) {
              pcVar15 = curl_maprintf("Host: %s\r\n",pcVar16);
              if (pcVar15 == (char *)0x0) {
                (*Curl_cfree)(pcVar16);
                goto LAB_0013c15e;
              }
            }
            else {
              pcVar15 = (char *)0x0;
            }
            CVar10 = Curl_http_output_auth(data,local_b0,"CONNECT",HTTPREQ_GET,pcVar16,true);
            pcVar23 = local_b0;
            if (CVar10 == CURLE_OK) {
              pcVar19 = "1.1";
              if ((local_b0->http_proxy).proxytype == '\x01') {
                pcVar19 = "1.0";
              }
              pcVar21 = pcVar15;
              if (pcVar15 == (char *)0x0) {
                pcVar21 = "";
              }
              pcVar22 = (data->state).aptr.proxyuserpwd;
              if (pcVar22 == (char *)0x0) {
                pcVar22 = "";
              }
              local_a0 = pcVar24;
              CVar11 = Curl_dyn_addf(local_90,"CONNECT %s HTTP/%s\r\n%s%s",pcVar16,pcVar19,pcVar21,
                                     pcVar22);
              pcVar24 = local_a0;
              if ((((CVar11 == CURLE_OK) &&
                   ((((pcVar19 = Curl_checkProxyheaders(data,pcVar23,"User-Agent",10),
                      pcVar19 != (char *)0x0 || ((data->set).str[0x24] == (char *)0x0)) ||
                     (CVar11 = Curl_dyn_addf(local_90,"User-Agent: %s\r\n"), pcVar24 = local_a0,
                     CVar11 == CURLE_OK)) &&
                    ((pcVar19 = Curl_checkProxyheaders(data,local_b0,"Proxy-Connection",0x10),
                     pcVar24 = local_a0, pcVar19 != (char *)0x0 ||
                     (CVar11 = Curl_dyn_addn(local_90,"Proxy-Connection: Keep-Alive\r\n",0x1e),
                     CVar11 == CURLE_OK)))))) &&
                  (CVar11 = Curl_add_custom_headers(data,true,local_90), CVar11 == CURLE_OK)) &&
                 (CVar11 = Curl_dyn_addn(local_90,"\r\n",2), CVar11 == CURLE_OK)) {
                CVar10 = CURLE_OK;
                CVar11 = Curl_buffer_send(local_90,data,local_48,0,local_a4);
                phVar20->headerlines = 0;
                if (CVar11 == CURLE_OK) goto LAB_0013b855;
              }
              Curl_failf(data,"Failed sending CONNECT to proxy");
              CVar10 = CVar11;
            }
LAB_0013b855:
            (*Curl_cfree)(pcVar15);
            (*Curl_cfree)(pcVar16);
            if (CVar10 != CURLE_OK) goto LAB_0013c15e;
            phVar20->tunnel_state = TUNNEL_CONNECT;
            pcVar23 = local_b0;
          }
          tVar17 = Curl_timeleft(data,(curltime *)0x0,true);
          if (tVar17 < 1) {
            Curl_failf(data,"Proxy CONNECT aborted due to timeout");
            CVar10 = CURLE_OPERATION_TIMEDOUT;
            goto LAB_0013c15e;
          }
          _Var7 = Curl_conn_data_pending(pcVar23,local_a4);
          if ((local_58.http)->sending == HTTPSEND_NADA && !_Var7) goto LAB_0013b4dd;
          if ((local_58.http)->sending == HTTPSEND_REQUEST) {
            sVar18 = phVar20->nsend;
            if (phVar20->nsend == 0) {
              (data->req).upload_fromhere = (data->state).ulbuf;
              CVar10 = Curl_fillreadbuffer(data,(ulong)(data->set).upload_buffer_size,&local_98);
              if (CVar10 != CURLE_OK) goto LAB_0013c15e;
              phVar20->nsend = local_98;
              sVar18 = local_98;
              if (local_98 == 0) {
                (local_58.http)->sending = HTTPSEND_NADA;
                goto LAB_0013b921;
              }
            }
            CVar10 = Curl_write(data,pcVar23->writesockfd,(data->req).upload_fromhere,sVar18,
                                (ssize_t *)&local_98);
            if (CVar10 == CURLE_OK) {
              Curl_debug(data,CURLINFO_HEADER_OUT,(data->req).upload_fromhere,local_98);
            }
            phVar20->nsend = phVar20->nsend - local_98;
            ppcVar2 = &(data->req).upload_fromhere;
            *ppcVar2 = *ppcVar2 + local_98;
LAB_0013c155:
            if (CVar10 != CURLE_OK) goto LAB_0013c15e;
            goto LAB_0013b4dd;
          }
LAB_0013b921:
          CVar11 = CURLE_OK;
          if (phVar20->keepon != KEEPON_DONE) {
            CVar12 = Curl_read(data,local_68,&local_b1,1,(ssize_t *)&local_98);
            while( true ) {
              CVar10 = CVar11;
              if (CVar12 == CURLE_AGAIN) goto LAB_0013c155;
              iVar13 = Curl_pgrsUpdate(data);
              if (iVar13 != 0) {
                CVar10 = CURLE_ABORTED_BY_CALLBACK;
                goto LAB_0013c155;
              }
              if (CVar12 != CURLE_OK) break;
              if ((long)local_98 < 1) {
                if ((((data->set).proxyauth == 0) || ((data->state).authproxy.avail == 0)) ||
                   ((data->state).aptr.proxyuserpwd == (char *)0x0)) {
                  Curl_failf(data,"Proxy CONNECT aborted");
                  CVar11 = CURLE_UNSUPPORTED_PROTOCOL;
                }
                else {
                  puVar3 = &(pcVar23->bits).field_0x4;
                  *puVar3 = *puVar3 | 0x10;
                  CVar11 = CURLE_OK;
                  Curl_infof(data,"Proxy CONNECT connection closed");
                }
                phVar20->keepon = KEEPON_DONE;
                goto LAB_0013be9b;
              }
              if (phVar20->keepon == KEEPON_IGNORE) {
                lVar4 = *local_80;
                if (lVar4 == 0) {
                  local_50 = 0;
                  CVar14 = Curl_httpchunk_read(data,&local_b1,1,&local_50,&local_34);
                  if (CVar14 == CHUNKE_STOP) {
                    Curl_infof(data,"chunk reading DONE");
                    phVar20->keepon = KEEPON_DONE;
LAB_0013bc0c:
                    phVar20->tunnel_state = TUNNEL_COMPLETE;
                  }
                }
                else {
                  *local_80 = lVar4 + -1;
                  if (lVar4 < 2) {
                    phVar20->keepon = KEEPON_DONE;
                    phVar20->tunnel_state = TUNNEL_COMPLETE;
                    goto LAB_0013be98;
                  }
                }
LAB_0013bc76:
                if (phVar20->keepon == KEEPON_DONE) goto LAB_0013be98;
              }
              else {
                CVar10 = Curl_dyn_addn(local_78,&local_b1,1);
                s = local_78;
                if (CVar10 != CURLE_OK) {
                  Curl_failf(data,"CONNECT response too large");
                  CVar10 = CURLE_RECV_ERROR;
                  goto LAB_0013c155;
                }
                if (local_b1 != '\n') goto LAB_0013bc76;
                phVar20->headerlines = phVar20->headerlines + 1;
                pcVar16 = Curl_dyn_ptr(local_78);
                sVar18 = Curl_dyn_len(s);
                Curl_debug(data,CURLINFO_HEADER_IN,pcVar16,sVar18);
                uVar5 = *(ulong *)&(data->set).field_0x8e2;
                if (((uVar5 >> 0x2b & 1) == 0) &&
                   (CVar10 = Curl_client_write(data,((uint)(uVar5 >> 0x16) & 1) + 10 +
                                                    (uint)(phVar20->headerlines == 1) * 4,pcVar16,
                                               sVar18), CVar10 != CURLE_OK)) goto LAB_0013c155;
                pcVar1 = &(data->info).header_size;
                *pcVar1 = *pcVar1 + sVar18;
                if ((*pcVar16 != '\r') && (*pcVar16 != '\n')) {
                  local_a0 = pcVar24;
                  iVar13 = curl_strnequal(pcVar16,"WWW-Authenticate:",0x11);
                  if ((iVar13 == 0) || (*local_88 != 0x191)) {
                    iVar13 = curl_strnequal(pcVar16,"Proxy-authenticate:",0x13);
                    if ((iVar13 != 0) && (_Var7 = true, *local_88 == 0x197)) goto LAB_0013bb63;
                    iVar13 = curl_strnequal(pcVar16,"Content-Length:",0xf);
                    pcVar24 = local_a0;
                    if (iVar13 == 0) {
                      _Var7 = Curl_compareheader(pcVar16,"Connection:",0xb,"close",5);
                      pcVar24 = local_a0;
                      if (_Var7) {
LAB_0013bc46:
                        phVar20->field_0x354 = phVar20->field_0x354 | 2;
                      }
                      else {
                        iVar13 = curl_strnequal(pcVar16,"Transfer-Encoding:",0x12);
                        if (iVar13 == 0) {
                          _Var7 = Curl_compareheader(pcVar16,"Proxy-Connection:",0x11,"close",5);
                          if (_Var7) goto LAB_0013bc46;
                          iVar13 = __isoc99_sscanf(pcVar16,"HTTP/1.%d %d",&local_64,local_88);
                          if (iVar13 == 2) {
                            (data->info).httpproxycode = (data->req).httpcode;
                          }
                        }
                        else {
                          if (*local_88 - 200U < 100) {
                            pcVar16 = "Ignoring Transfer-Encoding in CONNECT %03d response";
                            goto LAB_0013bbe1;
                          }
                          _Var7 = Curl_compareheader(pcVar16,"Transfer-Encoding:",0x12,"chunked",7);
                          if (_Var7) {
                            Curl_infof(data,"CONNECT responded chunked");
                            phVar20->field_0x354 = phVar20->field_0x354 | 1;
                            Curl_httpchunk_init(data);
                          }
                        }
                      }
                    }
                    else if (*local_88 - 200U < 100) {
                      pcVar16 = "Ignoring Content-Length in CONNECT %03d response";
LAB_0013bbe1:
                      Curl_infof(data,pcVar16);
                    }
                    else {
                      curlx_strtoofft(pcVar16 + 0xf,(char **)0x0,10,local_80);
                    }
                  }
                  else {
                    _Var7 = false;
LAB_0013bb63:
                    pcVar16 = Curl_copy_header_value(pcVar16);
                    if (pcVar16 == (char *)0x0) {
                      CVar10 = CURLE_OUT_OF_MEMORY;
                      pcVar24 = local_a0;
                      goto LAB_0013c155;
                    }
                    CVar10 = Curl_http_input_auth(data,_Var7,pcVar16);
                    (*Curl_cfree)(pcVar16);
                    pcVar24 = local_a0;
                    if (CVar10 != CURLE_OK) goto LAB_0013c155;
                  }
                  Curl_dyn_reset(local_78);
                  pcVar23 = local_b0;
                  goto LAB_0013bc76;
                }
                if ((*local_88 != 0x197) || (((data->state).field_0x6d0 & 0x20) != 0)) {
LAB_0013bbf7:
                  phVar20->keepon = KEEPON_DONE;
LAB_0013bc06:
                  pcVar23 = local_b0;
                  if (*local_80 == 0) goto LAB_0013bc0c;
                  goto LAB_0013bc76;
                }
                phVar20->keepon = KEEPON_IGNORE;
                if (phVar20->cl == 0) {
                  if ((phVar20->field_0x354 & 1) == 0) goto LAB_0013bbf7;
                  Curl_infof(data,"Ignore chunked response-body");
                  puVar3 = &(data->req).field_0xd9;
                  *puVar3 = *puVar3 | 8;
                  pcVar15 = pcVar16 + 1;
                  if (pcVar16[1] != '\n') {
                    pcVar15 = pcVar16;
                  }
                  CVar14 = Curl_httpchunk_read(data,pcVar15 + 1,1,(ssize_t *)&local_98,
                                               (CURLcode *)&local_50);
                  if (CVar14 == CHUNKE_STOP) {
                    Curl_infof(data,"chunk reading DONE");
                    phVar20->keepon = KEEPON_DONE;
                    phVar20->tunnel_state = TUNNEL_COMPLETE;
                  }
                }
                else {
                  Curl_infof(data,"Ignore %ld bytes of response-body");
                }
                pcVar23 = local_b0;
                if (phVar20->keepon == KEEPON_DONE) goto LAB_0013bc06;
              }
              CVar12 = Curl_read(data,local_68,&local_b1,1,(ssize_t *)&local_98);
            }
            phVar20->keepon = KEEPON_DONE;
LAB_0013be98:
            CVar11 = CURLE_OK;
          }
LAB_0013be9b:
          iVar13 = Curl_pgrsUpdate(data);
          if (((char)CVar11 != '\0') || (iVar13 != 0)) {
            CVar10 = CURLE_RECV_ERROR;
            if (iVar13 != 0) {
              CVar10 = CURLE_ABORTED_BY_CALLBACK;
            }
            goto LAB_0013c15e;
          }
          if ((data->info).httpproxycode - 200U < 100) {
            bVar8 = phVar20->field_0x354;
          }
          else {
            CVar10 = Curl_http_auth_act(data);
            if (CVar10 != CURLE_OK) goto LAB_0013c15e;
            bVar8 = phVar20->field_0x354;
            if (((pcVar23->bits).field_0x4 & 0x40) != 0) {
              bVar8 = bVar8 | 2;
              phVar20->field_0x354 = bVar8;
            }
          }
          pcVar6 = local_60;
          pcVar16 = (data->req).newurl;
          if ((bVar8 & 2) != 0) {
            if (pcVar16 != (char *)0x0) {
              Curl_closesocket(data,pcVar23,*local_60);
              *pcVar6 = -1;
            }
            goto LAB_0013c012;
          }
          if (pcVar16 == (char *)0x0) goto LAB_0013c012;
          aVar9 = phVar20->tunnel_state;
        } while (aVar9 != TUNNEL_COMPLETE);
        connect_init(data,true);
      } while ((data->req).newurl != (char *)0x0);
LAB_0013c012:
      if ((data->info).httpproxycode - 200U < 100) {
        phVar20->tunnel_state = TUNNEL_COMPLETE;
        (*Curl_cfree)((data->state).aptr.proxyuserpwd);
        (data->state).aptr.proxyuserpwd = (char *)0x0;
        (data->state).authproxy.field_0x18 = ((data->state).authproxy.field_0x18 & 0xfc) + 1;
        Curl_infof(data,"Proxy replied %d to CONNECT request",
                   (ulong)(uint)(data->info).httpproxycode);
        puVar3 = &(data->req).field_0xd9;
        *puVar3 = *puVar3 & 0xf7;
        puVar3 = &(pcVar23->bits).field_0x6;
        *puVar3 = *puVar3 & 0xfd;
        Curl_dyn_free(local_78);
      }
      else {
        pcVar16 = (data->req).newurl;
        if (pcVar16 == (char *)0x0 || (phVar20->field_0x354 & 2) == 0) {
          (*Curl_cfree)(pcVar16);
          (data->req).newurl = (char *)0x0;
          Curl_conncontrol(pcVar23,2);
        }
        else {
          puVar3 = &(pcVar23->bits).field_0x4;
          *puVar3 = *puVar3 | 0x10;
          Curl_infof(data,"Connect me again please");
          Curl_connect_done(data);
        }
        phVar20->tunnel_state = TUNNEL_INIT;
        if (((pcVar23->bits).field_0x4 & 0x10) == 0) {
          Curl_dyn_free(local_78);
          Curl_failf(data,"Received HTTP code %d from proxy after CONNECT",
                     (ulong)(uint)(data->req).httpcode);
          CVar10 = CURLE_RECV_ERROR;
          goto LAB_0013c15e;
        }
      }
    }
  }
LAB_0013b4dd:
  CVar10 = CURLE_OK;
  if ((pcVar24->connect_state != (http_connect_state *)0x0) &&
     (pcVar24->connect_state->tunnel_state < TUNNEL_COMPLETE)) {
    return CURLE_OK;
  }
LAB_0013c15e:
  Curl_connect_done(data);
  return CVar10;
}

Assistant:

CURLcode Curl_proxyCONNECT(struct Curl_easy *data,
                           int sockindex,
                           const char *hostname,
                           int remote_port)
{
  CURLcode result;
  struct connectdata *conn = data->conn;
  if(!conn->connect_state) {
    result = connect_init(data, FALSE);
    if(result)
      return result;
  }
  result = CONNECT(data, sockindex, hostname, remote_port);

  if(result || Curl_connect_complete(conn))
    Curl_connect_done(data);

  return result;
}